

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FailoverStrategy.cpp
# Opt level: O0

void __thiscall
xmrig::FailoverStrategy::FailoverStrategy
          (FailoverStrategy *this,int retryPause,int retries,IStrategyListener *listener,bool quiet)

{
  _func_int **in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  IStrategy *in_RDI;
  byte in_R8B;
  
  IStrategy::IStrategy(in_RDI);
  IClientListener::IClientListener((IClientListener *)(in_RDI + 1));
  in_RDI->_vptr_IStrategy = (_func_int **)&PTR__FailoverStrategy_002b73c0;
  in_RDI[1]._vptr_IStrategy = (_func_int **)&DAT_002b7440;
  *(byte *)&in_RDI[2]._vptr_IStrategy = in_R8B & 1;
  *(undefined4 *)((long)&in_RDI[2]._vptr_IStrategy + 4) = in_EDX;
  *(undefined4 *)&in_RDI[3]._vptr_IStrategy = in_ESI;
  *(undefined4 *)((long)&in_RDI[3]._vptr_IStrategy + 4) = 0xffffffff;
  in_RDI[4]._vptr_IStrategy = in_RCX;
  in_RDI[5]._vptr_IStrategy = (_func_int **)0x0;
  std::vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>::vector
            ((vector<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_> *)0x1d2b05);
  return;
}

Assistant:

xmrig::FailoverStrategy::FailoverStrategy(int retryPause, int retries, IStrategyListener *listener, bool quiet) :
    m_quiet(quiet),
    m_retries(retries),
    m_retryPause(retryPause),
    m_active(-1),
    m_listener(listener),
    m_index(0)
{
}